

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void * __thiscall CASC_ARRAY::InsertAt(CASC_ARRAY *this,size_t ItemIndex)

{
  size_t sVar1;
  bool bVar2;
  ulong uVar3;
  LPBYTE pBVar4;
  long lVar5;
  
  uVar3 = this->m_ItemCount;
  lVar5 = ItemIndex - uVar3;
  if (ItemIndex < uVar3 || lVar5 == 0) {
LAB_001126c3:
    if (uVar3 == ItemIndex) {
      bVar2 = EnlargeArray(this,ItemIndex + 1);
      uVar3 = this->m_ItemCount;
      if (bVar2) {
        uVar3 = uVar3 + 1;
        this->m_ItemCount = uVar3;
      }
    }
    if (uVar3 <= ItemIndex) {
      __assert_fail("ItemIndex < m_ItemCount",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/Array.h"
                    ,0x40,"void *CASC_ARRAY::ItemAt(size_t)");
    }
    pBVar4 = this->m_pItemArray + ItemIndex * this->m_ItemSize;
  }
  else {
    bVar2 = EnlargeArray(this,ItemIndex);
    if (bVar2) {
      sVar1 = this->m_ItemCount;
      this->m_ItemCount = sVar1 + lVar5;
      if (this->m_pItemArray != (LPBYTE)0x0) {
        memset(this->m_pItemArray + sVar1 * this->m_ItemSize,0,lVar5 * this->m_ItemSize);
        uVar3 = this->m_ItemCount;
        goto LAB_001126c3;
      }
    }
    pBVar4 = (LPBYTE)0x0;
  }
  return pBVar4;
}

Assistant:

void * InsertAt(size_t ItemIndex)
    {
        void * pNewItem;
        size_t AddedItemCount;

        // Is there enough items?
        if (ItemIndex > m_ItemCount)
        {
            // Capture the new item count
            AddedItemCount = ItemIndex - m_ItemCount;

            // Insert the amount of items
            pNewItem = Insert(NULL, AddedItemCount);
            if (pNewItem == NULL)
                return NULL;

            // Zero the inserted items
            memset(pNewItem, 0, m_ItemSize * AddedItemCount);
        }

        // Is the item already inserted?
        if (ItemIndex == m_ItemCount)
        {
            Insert(NULL, 1);
        }

        // Return the item at a given index
        return ItemAt(ItemIndex);
    }